

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O1

void adl_setNoteHook(ADL_MIDIPlayer *device,ADL_NoteHook noteHook,void *userData)

{
  void *pvVar1;
  
  if (device != (ADL_MIDIPlayer *)0x0) {
    pvVar1 = device->adl_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x4c8,"void adl_setNoteHook(struct ADL_MIDIPlayer *, ADL_NoteHook, void *)");
    }
    *(ADL_NoteHook *)((long)pvVar1 + 0x20) = noteHook;
    *(void **)((long)pvVar1 + 0x28) = userData;
  }
  return;
}

Assistant:

ADLMIDI_EXPORT void adl_setNoteHook(struct ADL_MIDIPlayer *device, ADL_NoteHook noteHook, void *userData)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->hooks.onNote = noteHook;
    play->hooks.onNote_userData = userData;
}